

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::~MessageGenerator(MessageGenerator *this)

{
  MessageGenerator *this_local;
  
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
  ::~scoped_array(&this->extension_generators_);
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
  ::~scoped_array(&this->enum_generators_);
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
  ::~scoped_array(&this->nested_generators_);
  FieldGeneratorMap::~FieldGeneratorMap(&this->field_generators_);
  Options::~Options(&this->options_);
  std::__cxx11::string::~string((string *)&this->classname_);
  return;
}

Assistant:

MessageGenerator::~MessageGenerator() {}